

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

MOJOSHADER_preshader * copypreshader(MOJOSHADER_preshader *src,MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  MOJOSHADER_preshader *__s;
  double *pdVar2;
  MOJOSHADER_symbol *pMVar3;
  MOJOSHADER_preshaderInstruction *pMVar4;
  uint *puVar5;
  float *pfVar6;
  MOJOSHADER_preshader *retval;
  uint local_28;
  uint32 siz;
  int j;
  int i;
  void *d_local;
  MOJOSHADER_malloc m_local;
  MOJOSHADER_preshader *src_local;
  
  __s = (MOJOSHADER_preshader *)(*m)(0x58,d);
  memset(__s,0,0x58);
  uVar1 = src->literal_count << 3;
  __s->literal_count = src->literal_count;
  pdVar2 = (double *)(*m)(uVar1,d);
  __s->literals = pdVar2;
  memcpy(__s->literals,src->literals,(ulong)uVar1);
  __s->temp_count = src->temp_count;
  uVar1 = src->symbol_count * 0x38;
  __s->symbol_count = src->symbol_count;
  pMVar3 = (MOJOSHADER_symbol *)(*m)(uVar1,d);
  __s->symbols = pMVar3;
  memset(__s->symbols,0,(ulong)uVar1);
  for (siz = 0; siz < __s->symbol_count; siz = siz + 1) {
    copysymbol(__s->symbols + (int)siz,src->symbols + (int)siz,m,d);
  }
  uVar1 = src->instruction_count * 0x70;
  __s->instruction_count = src->instruction_count;
  pMVar4 = (MOJOSHADER_preshaderInstruction *)(*m)(uVar1,d);
  __s->instructions = pMVar4;
  memcpy(__s->instructions,src->instructions,(ulong)uVar1);
  for (siz = 0; siz < __s->instruction_count; siz = siz + 1) {
    for (local_28 = 0; local_28 < __s->instructions[(int)siz].operand_count; local_28 = local_28 + 1
        ) {
      uVar1 = __s->instructions[(int)siz].operands[(int)local_28].array_register_count << 2;
      puVar5 = (uint *)(*m)(uVar1,d);
      __s->instructions[(int)siz].operands[(int)local_28].array_registers = puVar5;
      memcpy(__s->instructions[(int)siz].operands[(int)local_28].array_registers,
             src->instructions[(int)siz].operands[(int)local_28].array_registers,(ulong)uVar1);
    }
  }
  uVar1 = src->register_count << 4;
  __s->register_count = src->register_count;
  pfVar6 = (float *)(*m)(uVar1,d);
  __s->registers = pfVar6;
  memcpy(__s->registers,src->registers,(ulong)uVar1);
  return __s;
}

Assistant:

MOJOSHADER_preshader *copypreshader(const MOJOSHADER_preshader *src,
                                    MOJOSHADER_malloc m,
                                    void *d)
{
    int i, j;
    uint32 siz;
    MOJOSHADER_preshader *retval;

    retval = (MOJOSHADER_preshader *) m(sizeof (MOJOSHADER_preshader), d);
    // !!! FIXME: Out of memory check!
    memset(retval, '\0', sizeof (MOJOSHADER_preshader));

    siz = sizeof (double) * src->literal_count;
    retval->literal_count = src->literal_count;
    retval->literals = (double *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->literals, src->literals, siz);

    retval->temp_count = src->temp_count;

    siz = sizeof (MOJOSHADER_symbol) * src->symbol_count;
    retval->symbol_count = src->symbol_count;
    retval->symbols = (MOJOSHADER_symbol *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->symbols, '\0', siz);

    for (i = 0; i < retval->symbol_count; i++)
        copysymbol(&retval->symbols[i], &src->symbols[i], m, d);

    siz = sizeof (MOJOSHADER_preshaderInstruction) * src->instruction_count;
    retval->instruction_count = src->instruction_count;
    retval->instructions = (MOJOSHADER_preshaderInstruction *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->instructions, src->instructions, siz);
    for (i = 0; i < retval->instruction_count; i++)
        for (j = 0; j < retval->instructions[i].operand_count; j++)
        {
            siz = sizeof (unsigned int) * retval->instructions[i].operands[j].array_register_count;
            retval->instructions[i].operands[j].array_registers = (unsigned int *) m(siz, d);
            // !!! FIXME: Out of memory check!
            memcpy(retval->instructions[i].operands[j].array_registers,
                   src->instructions[i].operands[j].array_registers,
                   siz);
        } // for

    siz = sizeof (float) * 4 * src->register_count;
    retval->register_count = src->register_count;
    retval->registers = (float *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->registers, src->registers, siz);

    return retval;
}